

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatTest_UdlTemplate_Test::TestBody(FormatTest_UdlTemplate_Test *this)

{
  size_t *psVar1;
  parse_func *pp_Var2;
  AssertHelperData *pAVar3;
  bool bVar4;
  format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *handler;
  char *pcVar5;
  basic_string_view<char> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  basic_string_view<char> format_str_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  undefined1 local_868 [32];
  AssertHelper local_848 [3];
  udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125> local_830 [8];
  undefined8 *local_828;
  format_string_checker<char,_fmt::v5::internal::error_handler,_int> local_820 [50];
  
  fmt::v5::internal::udl_formatter<char,_'f',_'o',_'o'>::operator()<>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820,
             (udl_formatter<char,__f_,__o_,__o_> *)local_848);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_868,"\"foo\"","\"foo\"_format()",(char (*) [4])0x2491a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820);
  psVar1 = &local_820[0].context_.format_str_.size_;
  if ((size_t *)local_820[0]._0_8_ != psVar1) {
    operator_delete((void *)local_820[0]._0_8_);
  }
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_820);
    if ((undefined8 *)local_868._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_868._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x771,pcVar5);
    testing::internal::AssertHelper::operator=(local_848,(Message *)local_820);
    testing::internal::AssertHelper::~AssertHelper(local_848);
    if ((long *)local_820[0]._0_8_ != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_820[0]._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_820[0]._0_8_ + 8))();
      }
      local_820[0]._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_868 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_._0_4_ = 0x2a;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
  operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820,
             local_830,(int *)local_848);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)local_868,"\"        42\"","\"{0:10}\"_format(42)",
             (char (*) [11])"        42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820);
  if ((size_t *)local_820[0]._0_8_ != psVar1) {
    operator_delete((void *)local_820[0]._0_8_);
  }
  if (local_868[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_820);
    if ((undefined8 *)local_868._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_868._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x772,pcVar5);
    testing::internal::AssertHelper::operator=(local_848,(Message *)local_820);
    testing::internal::AssertHelper::~AssertHelper(local_848);
    if ((long *)local_820[0]._0_8_ != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_820[0]._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_820[0]._0_8_ + 8))();
      }
      local_820[0]._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_868 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_ = (AssertHelperData *)&DAT_0000002a;
  local_820[0].arg_id_ = 0xffffffff;
  local_820[0].context_.format_str_.data_ = "{}";
  local_820[0].context_.format_str_.size_ = 2;
  local_820[0].context_._16_8_ = (ulong)(uint)local_820[0].context_._20_4_ << 0x20;
  local_820[0].parse_funcs_[0] =
       fmt::v5::internal::
       parse_format_specs<int,fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>;
  format_str_02.size_ = 2;
  format_str_02.data_ = "{}";
  fmt::v5::internal::
  parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,int>&>
            (format_str_02,local_820);
  local_820[0].context_.format_str_.size_ = 0;
  local_820[0]._0_8_ = &PTR_grow_002a8bf0;
  pp_Var2 = local_820[0].parse_funcs_;
  local_820[0].context_._16_8_ = 500;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_848;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_820[0].context_.format_str_.data_ = (char *)pp_Var2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_820,format_str,args,(locale_ref)0x0);
  pAVar3 = (AssertHelperData *)(local_868 + 0x10);
  local_868._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,local_820[0].context_.format_str_.data_,
             (undefined1 *)
             ((long)local_820[0].context_.format_str_.data_ +
             local_820[0].context_.format_str_.size_));
  local_820[0]._0_8_ = &PTR_grow_002a8bf0;
  if ((parse_func *)local_820[0].context_.format_str_.data_ != pp_Var2) {
    operator_delete(local_820[0].context_.format_str_.data_);
  }
  handler = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *)0x248e7f;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_830,"\"42\"",
             "fmt::format([] { typedef typename std::remove_cv<std::remove_pointer< typename std::decay<decltype(\"{}\")>::type>::type>::type ct; struct str : fmt::compile_string { typedef ct char_type; inline operator fmt::basic_string_view<ct>() const { return {\"{}\", sizeof(\"{}\") / sizeof(ct) - 1}; } }; return str{}; }(), 42)"
             ,(char (*) [3])0x248e7f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868);
  if ((AssertHelperData *)local_868._0_8_ != pAVar3) {
    operator_delete((void *)local_868._0_8_);
  }
  if (local_830[0] ==
      (udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>)0x0) {
    testing::Message::Message((Message *)local_820);
    if (local_828 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_828;
    }
    handler = (format_string_checker<wchar_t,_fmt::v5::internal::error_handler,_int> *)0x773;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x773,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_868,(Message *)local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_868);
    if ((undefined **)local_820[0]._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_820[0]._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820[0]._0_8_ + 8))();
      }
      local_820[0]._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_830 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_848[0].data_ = (AssertHelperData *)&DAT_0000002a;
  local_820[0].arg_id_ = 0xffffffff;
  local_820[0].context_.format_str_.data_ = "{}";
  local_820[0].context_.format_str_.size_ = 2;
  local_820[0].context_._16_8_ = local_820[0].context_._16_8_ & 0xffffffff00000000;
  local_820[0].parse_funcs_[0] =
       fmt::v5::internal::
       parse_format_specs<int,fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>
  ;
  format_str_00.size_ = (size_t)local_820;
  format_str_00.data_ = (wchar_t *)0x2;
  fmt::v5::internal::
  parse_format_string<true,wchar_t,fmt::v5::internal::format_string_checker<wchar_t,fmt::v5::internal::error_handler,int>&>
            ((internal *)0x24bb6c,format_str_00,handler);
  local_820[0].context_.format_str_.size_ = 0;
  local_820[0]._0_8_ = &PTR_grow_002a8d18;
  local_820[0].context_.next_arg_id_ = 500;
  local_820[0].context_._20_4_ = 0;
  format_str_01.size_ = 2;
  format_str_01.data_ = L"{}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_848;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  local_820[0].context_.format_str_.data_ = (char *)pp_Var2;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)local_820,format_str_01,args_00,(locale_ref)0x0);
  local_868._0_8_ = pAVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_868,local_820[0].context_.format_str_.data_,
             (undefined1 *)
             ((long)local_820[0].context_.format_str_.data_ +
             local_820[0].context_.format_str_.size_ * 4));
  local_820[0]._0_8_ = &PTR_grow_002a8d18;
  if ((parse_func *)local_820[0].context_.format_str_.data_ != pp_Var2) {
    operator_delete(local_820[0].context_.format_str_.data_);
  }
  testing::internal::CmpHelperEQ<wchar_t[3],std::__cxx11::wstring>
            ((internal *)local_830,"L\"42\"",
             "fmt::format([] { typedef typename std::remove_cv<std::remove_pointer< typename std::decay<decltype(L\"{}\")>::type>::type>::type ct; struct str : fmt::compile_string { typedef ct char_type; inline operator fmt::basic_string_view<ct>() const { return {L\"{}\", sizeof(L\"{}\") / sizeof(ct) - 1}; } }; return str{}; }(), 42)"
             ,(wchar_t (*) [3])L"42",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_868
            );
  if ((AssertHelperData *)local_868._0_8_ != pAVar3) {
    operator_delete((void *)local_868._0_8_);
  }
  if (local_830[0] ==
      (udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>)0x0) {
    testing::Message::Message((Message *)local_820);
    if (local_828 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_828;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x774,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_868,(Message *)local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_868);
    if ((undefined **)local_820[0]._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_820[0]._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_820[0]._0_8_ + 8))();
      }
      local_820[0]._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_830 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(FormatTest, UdlTemplate) {
  EXPECT_EQ("foo", "foo"_format());
  EXPECT_EQ("        42", "{0:10}"_format(42));
  EXPECT_EQ("42", fmt::format(FMT_STRING("{}"), 42));
  EXPECT_EQ(L"42", fmt::format(FMT_STRING(L"{}"), 42));
}